

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_int32 *
ma_dr_wav_open_file_and_read_pcm_frames_s32
          (char *filename,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalFrameCountOut,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_int32 *pmVar2;
  ma_dr_wav wav;
  ma_dr_wav mStack_1a8;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (ma_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  mVar1 = ma_dr_wav_init_file(&mStack_1a8,filename,pAllocationCallbacks);
  if (mVar1 == 0) {
    pmVar2 = (ma_int32 *)0x0;
  }
  else {
    pmVar2 = ma_dr_wav__read_pcm_frames_and_close_s32
                       (&mStack_1a8,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pmVar2;
}

Assistant:

MA_API ma_int32* ma_dr_wav_open_file_and_read_pcm_frames_s32(const char* filename, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init_file(&wav, filename, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_s32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}